

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3RenameTokenMap(Parse *pParse,void *pPtr,Token *pToken)

{
  uint uVar1;
  undefined4 uVar2;
  RenameToken *pRVar3;
  
  pRVar3 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20);
  if (pRVar3 != (RenameToken *)0x0) {
    pRVar3->p = pPtr;
    uVar1 = pToken->n;
    uVar2 = *(undefined4 *)&pToken->field_0xc;
    (pRVar3->t).z = pToken->z;
    (pRVar3->t).n = uVar1;
    *(undefined4 *)&(pRVar3->t).field_0xc = uVar2;
    pRVar3->pNext = pParse->pRename;
    pParse->pRename = pRVar3;
  }
  return pPtr;
}

Assistant:

SQLITE_PRIVATE void *sqlite3RenameTokenMap(Parse *pParse, void *pPtr, Token *pToken){
  RenameToken *pNew;
  assert( pPtr || pParse->db->mallocFailed );
  renameTokenCheckAll(pParse, pPtr);
  pNew = sqlite3DbMallocZero(pParse->db, sizeof(RenameToken));
  if( pNew ){
    pNew->p = pPtr;
    pNew->t = *pToken;
    pNew->pNext = pParse->pRename;
    pParse->pRename = pNew;
  }

  return pPtr;
}